

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compositecodec.h
# Opt level: O0

void __thiscall
FastPForLib::CompositeCodec<FastPForLib::PFor,_FastPForLib::VariableByte>::~CompositeCodec
          (CompositeCodec<FastPForLib::PFor,_FastPForLib::VariableByte> *this)

{
  PFor *in_RDI;
  
  (in_RDI->super_IntegerCODEC)._vptr_IntegerCODEC = (_func_int **)&PTR_encodeArray_00480e08;
  VariableByte::~VariableByte((VariableByte *)0x14e6aa);
  PFor::~PFor(in_RDI);
  IntegerCODEC::~IntegerCODEC(&in_RDI->super_IntegerCODEC);
  return;
}

Assistant:

CompositeCodec() : codec1(), codec2() {}